

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O3

void * crnd::crnd_malloc(size_t size,size_t *pActual_size)

{
  void *pvVar1;
  ulong uVar2;
  char *pcVar3;
  ulong uVar4;
  size_t actual_size;
  char buf [512];
  ulong local_230;
  char local_228 [520];
  
  uVar2 = size + 3 & 0xfffffffffffffffc;
  uVar4 = 4;
  if (uVar2 != 0) {
    uVar4 = uVar2;
  }
  if (uVar4 < 0x7fff0001) {
    local_230 = uVar4;
    pvVar1 = (void *)(*(code *)g_pRealloc)(0,uVar4,&local_230,1,g_pUser_data);
    if (pActual_size != (size_t *)0x0) {
      *pActual_size = local_230;
    }
    if (uVar4 <= local_230 && pvVar1 != (void *)0x0) {
      return pvVar1;
    }
    pcVar3 = "crnd_malloc: out of memory";
  }
  else {
    pcVar3 = "crnd_malloc: size too big";
  }
  sprintf(local_228,"%s(%u): Assertion failure: \"%s\"\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/crnlib/../inc/crn_decomp.h"
          ,0x99a,pcVar3);
  puts(local_228);
  return (void *)0x0;
}

Assistant:

void* crnd_malloc(size_t size, size_t* pActual_size)
    {
        size = (size + sizeof(uint32) - 1U) & ~(sizeof(uint32) - 1U);
        if (!size)
            size = sizeof(uint32);

        if (size > MAX_POSSIBLE_BLOCK_SIZE)
        {
            crnd_mem_error("crnd_malloc: size too big");
            return NULL;
        }

        size_t actual_size = size;
        uint8* p_new = static_cast<uint8*>((*g_pRealloc)(NULL, size, &actual_size, true, g_pUser_data));

        if (pActual_size)
            *pActual_size = actual_size;

        if ((!p_new) || (actual_size < size))
        {
            crnd_mem_error("crnd_malloc: out of memory");
            return NULL;
        }

        CRND_ASSERT(((uint32) reinterpret_cast<uintptr_t>(p_new) & (CRND_MIN_ALLOC_ALIGNMENT - 1)) == 0);

        return p_new;
    }